

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O0

void __thiscall
wasm::Visitor<wasm::HashStringifyWalker,_void>::visit
          (Visitor<wasm::HashStringifyWalker,_void> *this,Expression *curr)

{
  Expression *curr_local;
  Visitor<wasm::HashStringifyWalker,_void> *this_local;
  
  if (curr != (Expression *)0x0) {
    switch(curr->_id) {
    case BlockId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitBlock
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Block *)curr);
      break;
    case IfId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitIf
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(If *)curr);
      break;
    case LoopId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitLoop
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Loop *)curr);
      break;
    case BreakId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitBreak
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Break *)curr);
      break;
    case SwitchId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitSwitch
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Switch *)curr);
      break;
    case CallId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitCall
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Call *)curr);
      break;
    case CallIndirectId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitCallIndirect
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (CallIndirect *)curr);
      break;
    case LocalGetId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitLocalGet
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(LocalGet *)curr)
      ;
      break;
    case LocalSetId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitLocalSet
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(LocalSet *)curr)
      ;
      break;
    case GlobalGetId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitGlobalGet
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(GlobalGet *)curr
                );
      break;
    case GlobalSetId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitGlobalSet
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(GlobalSet *)curr
                );
      break;
    case LoadId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitLoad
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Load *)curr);
      break;
    case StoreId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStore
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Store *)curr);
      break;
    case ConstId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitConst
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Const *)curr);
      break;
    case UnaryId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitUnary
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Unary *)curr);
      break;
    case BinaryId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitBinary
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Binary *)curr);
      break;
    case SelectId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitSelect
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Select *)curr);
      break;
    case DropId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitDrop
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Drop *)curr);
      break;
    case ReturnId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitReturn
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Return *)curr);
      break;
    case MemorySizeId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitMemorySize
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (MemorySize *)curr);
      break;
    case MemoryGrowId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitMemoryGrow
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (MemoryGrow *)curr);
      break;
    case NopId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitNop
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Nop *)curr);
      break;
    case UnreachableId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitUnreachable
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (Unreachable *)curr);
      break;
    case AtomicRMWId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitAtomicRMW
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(AtomicRMW *)curr
                );
      break;
    case AtomicCmpxchgId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitAtomicCmpxchg
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (AtomicCmpxchg *)curr);
      break;
    case AtomicWaitId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitAtomicWait
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (AtomicWait *)curr);
      break;
    case AtomicNotifyId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitAtomicNotify
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (AtomicNotify *)curr);
      break;
    case AtomicFenceId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitAtomicFence
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (AtomicFence *)curr);
      break;
    case SIMDExtractId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitSIMDExtract
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (SIMDExtract *)curr);
      break;
    case SIMDReplaceId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitSIMDReplace
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (SIMDReplace *)curr);
      break;
    case SIMDShuffleId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitSIMDShuffle
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (SIMDShuffle *)curr);
      break;
    case SIMDTernaryId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitSIMDTernary
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (SIMDTernary *)curr);
      break;
    case SIMDShiftId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitSIMDShift
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(SIMDShift *)curr
                );
      break;
    case SIMDLoadId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitSIMDLoad
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(SIMDLoad *)curr)
      ;
      break;
    case SIMDLoadStoreLaneId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitSIMDLoadStoreLane
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (SIMDLoadStoreLane *)curr);
      break;
    case MemoryInitId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitMemoryInit
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (MemoryInit *)curr);
      break;
    case DataDropId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitDataDrop
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(DataDrop *)curr)
      ;
      break;
    case MemoryCopyId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitMemoryCopy
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (MemoryCopy *)curr);
      break;
    case MemoryFillId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitMemoryFill
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (MemoryFill *)curr);
      break;
    case PopId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitPop
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Pop *)curr);
      break;
    case RefNullId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitRefNull
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(RefNull *)curr);
      break;
    case RefIsNullId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitRefIsNull
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(RefIsNull *)curr
                );
      break;
    case RefFuncId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitRefFunc
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(RefFunc *)curr);
      break;
    case RefEqId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitRefEq
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(RefEq *)curr);
      break;
    case TableGetId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitTableGet
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(TableGet *)curr)
      ;
      break;
    case TableSetId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitTableSet
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(TableSet *)curr)
      ;
      break;
    case TableSizeId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitTableSize
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(TableSize *)curr
                );
      break;
    case TableGrowId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitTableGrow
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(TableGrow *)curr
                );
      break;
    case TableFillId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitTableFill
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(TableFill *)curr
                );
      break;
    case TableCopyId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitTableCopy
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(TableCopy *)curr
                );
      break;
    case TableInitId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitTableInit
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(TableInit *)curr
                );
      break;
    case TryId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitTry
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Try *)curr);
      break;
    case TryTableId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitTryTable
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(TryTable *)curr)
      ;
      break;
    case ThrowId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitThrow
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Throw *)curr);
      break;
    case RethrowId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitRethrow
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Rethrow *)curr);
      break;
    case ThrowRefId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitThrowRef
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(ThrowRef *)curr)
      ;
      break;
    case TupleMakeId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitTupleMake
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(TupleMake *)curr
                );
      break;
    case TupleExtractId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitTupleExtract
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (TupleExtract *)curr);
      break;
    case RefI31Id:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitRefI31
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(RefI31 *)curr);
      break;
    case I31GetId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitI31Get
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(I31Get *)curr);
      break;
    case CallRefId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitCallRef
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(CallRef *)curr);
      break;
    case RefTestId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitRefTest
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(RefTest *)curr);
      break;
    case RefCastId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitRefCast
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(RefCast *)curr);
      break;
    case BrOnId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitBrOn
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(BrOn *)curr);
      break;
    case StructNewId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStructNew
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(StructNew *)curr
                );
      break;
    case StructGetId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStructGet
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(StructGet *)curr
                );
      break;
    case StructSetId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStructSet
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(StructSet *)curr
                );
      break;
    case StructRMWId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStructRMW
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(StructRMW *)curr
                );
      break;
    case StructCmpxchgId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStructCmpxchg
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (StructCmpxchg *)curr);
      break;
    case ArrayNewId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitArrayNew
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(ArrayNew *)curr)
      ;
      break;
    case ArrayNewDataId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitArrayNewData
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (ArrayNewData *)curr);
      break;
    case ArrayNewElemId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitArrayNewElem
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (ArrayNewElem *)curr);
      break;
    case ArrayNewFixedId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitArrayNewFixed
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (ArrayNewFixed *)curr);
      break;
    case ArrayGetId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitArrayGet
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(ArrayGet *)curr)
      ;
      break;
    case ArraySetId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitArraySet
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(ArraySet *)curr)
      ;
      break;
    case ArrayLenId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitArrayLen
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(ArrayLen *)curr)
      ;
      break;
    case ArrayCopyId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitArrayCopy
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(ArrayCopy *)curr
                );
      break;
    case ArrayFillId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitArrayFill
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(ArrayFill *)curr
                );
      break;
    case ArrayInitDataId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitArrayInitData
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (ArrayInitData *)curr);
      break;
    case ArrayInitElemId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitArrayInitElem
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (ArrayInitElem *)curr);
      break;
    case RefAsId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitRefAs
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(RefAs *)curr);
      break;
    case StringNewId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStringNew
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(StringNew *)curr
                );
      break;
    case StringConstId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStringConst
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (StringConst *)curr);
      break;
    case StringMeasureId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStringMeasure
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (StringMeasure *)curr);
      break;
    case StringEncodeId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStringEncode
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (StringEncode *)curr);
      break;
    case StringConcatId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStringConcat
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (StringConcat *)curr);
      break;
    case StringEqId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStringEq
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(StringEq *)curr)
      ;
      break;
    case StringWTF16GetId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStringWTF16Get
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (StringWTF16Get *)curr);
      break;
    case StringSliceWTFId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStringSliceWTF
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (StringSliceWTF *)curr);
      break;
    case ContNewId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitContNew
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(ContNew *)curr);
      break;
    case ContBindId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitContBind
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(ContBind *)curr)
      ;
      break;
    case SuspendId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitSuspend
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Suspend *)curr);
      break;
    case ResumeId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitResume
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,(Resume *)curr);
      break;
    case ResumeThrowId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitResumeThrow
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (ResumeThrow *)curr);
      break;
    case StackSwitchId:
      UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void>::visitStackSwitch
                ((UnifiedExpressionVisitor<wasm::HashStringifyWalker,_void> *)this,
                 (StackSwitch *)curr);
      break;
    default:
      ::wasm::handle_unreachable
                ("unexpected expression type",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                 ,0x46);
    }
    return;
  }
  __assert_fail("curr",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x3b,
                "ReturnType wasm::Visitor<wasm::HashStringifyWalker>::visit(Expression *) [SubType = wasm::HashStringifyWalker, ReturnType = void]"
               );
}

Assistant:

ReturnType visit(Expression* curr) {
    assert(curr);

    switch (curr->_id) {
#define DELEGATE(CLASS_TO_VISIT)                                               \
  case Expression::Id::CLASS_TO_VISIT##Id:                                     \
    return static_cast<SubType*>(this)->visit##CLASS_TO_VISIT(                 \
      static_cast<CLASS_TO_VISIT*>(curr))

#include "wasm-delegations.def"

      default:
        WASM_UNREACHABLE("unexpected expression type");
    }
  }